

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O3

DdNode * Cudd_addIteConstant(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  DdNode *pDVar1;
  DdNode *g_00;
  DdNode *h_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  uint uVar4;
  DdNode *h_01;
  uint uVar5;
  DdNode *g_01;
  uint uVar6;
  uint uVar7;
  DdNode *h_02;
  DdNode *g_1;
  
  pDVar1 = g;
  if ((dd->one != f) && (pDVar1 = h, dd->zero != f)) {
    g_01 = dd->one;
    if (g != f) {
      g_01 = g;
    }
    h_02 = dd->zero;
    if (h != f) {
      h_02 = h;
    }
    pDVar1 = g_01;
    if (g_01 != h_02) {
      uVar4 = g_01->index;
      if (((ulong)uVar4 != 0x7fffffff) || (pDVar1 = (DdNode *)0x1, h_02->index != 0x7fffffff)) {
        uVar6 = 0x7fffffff;
        uVar5 = 0x7fffffff;
        if ((ulong)f->index != 0x7fffffff) {
          uVar5 = dd->perm[f->index];
        }
        if (uVar4 != 0x7fffffff) {
          uVar6 = dd->perm[uVar4];
        }
        uVar4 = 0x7fffffff;
        if ((ulong)h_02->index != 0x7fffffff) {
          uVar4 = dd->perm[h_02->index];
        }
        uVar7 = uVar6;
        if (uVar4 < uVar6) {
          uVar7 = uVar4;
        }
        if ((((uVar7 <= uVar5) || (((f->type).kids.T)->index != 0x7fffffff)) ||
            (pDVar1 = (DdNode *)0x1, ((f->type).kids.E)->index != 0x7fffffff)) &&
           (pDVar1 = cuddConstantLookup(dd,0x62,f,g_01,h_02), pDVar1 == (DdNode *)0x0)) {
          pDVar3 = f;
          pDVar1 = f;
          if (uVar5 <= uVar7) {
            pDVar1 = (f->type).kids.T;
            pDVar3 = (f->type).kids.E;
            uVar7 = uVar5;
          }
          g_00 = g_01;
          pDVar2 = g_01;
          if (uVar6 == uVar7) {
            pDVar2 = (g_01->type).kids.T;
            g_00 = (g_01->type).kids.E;
          }
          h_00 = h_02;
          h_01 = h_02;
          if (uVar4 == uVar7) {
            h_01 = (h_02->type).kids.T;
            h_00 = (h_02->type).kids.E;
          }
          pDVar2 = Cudd_addIteConstant(dd,pDVar1,pDVar2,h_01);
          pDVar1 = (DdNode *)0x1;
          if (((pDVar2 != (DdNode *)0x1) && (pDVar2->index == 0x7fffffff)) &&
             (pDVar3 = Cudd_addIteConstant(dd,pDVar3,g_00,h_00), pDVar3 != (DdNode *)0x1)) {
            pDVar1 = (DdNode *)0x1;
            if (pDVar3->index == 0x7fffffff) {
              pDVar1 = pDVar2;
            }
            if (pDVar2 != pDVar3) {
              pDVar1 = (DdNode *)0x1;
            }
          }
          cuddCacheInsert(dd,0x62,f,g_01,h_02,pDVar1);
        }
      }
    }
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addIteConstant(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *one,*zero;
    DdNode *Fv,*Fnv,*Gv,*Gnv,*Hv,*Hnv,*r,*t,*e;
    unsigned int topf,topg,toph,v;

    statLine(dd);
    /* Trivial cases. */
    if (f == (one = DD_ONE(dd))) {      /* ITE(1,G,H) = G */
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {    /* ITE(0,G,H) = H */
        return(h);
    }

    /* From now on, f is known not to be a constant. */
    addVarToConst(f,&g,&h,one,zero);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }
    if (cuddIsConstant(g) && cuddIsConstant(h)) {
        return(DD_NON_CONSTANT);
    }

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    toph = cuddI(dd,h->index);
    v = ddMin(topg,toph);

    /* ITE(F,G,H) = (x,G,H) (non constant) if F = (x,1,0), x < top(G,H). */
    if (topf < v && cuddIsConstant(cuddT(f)) && cuddIsConstant(cuddE(f))) {
        return(DD_NON_CONSTANT);
    }

    /* Check cache. */
    r = cuddConstantLookup(dd,DD_ADD_ITE_CONSTANT_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf,v);      /* v = top_var(F,G,H) */
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        Hv = cuddT(h); Hnv = cuddE(h);
    } else {
        Hv = Hnv = h;
    }
    
    /* Recursive step. */
    t = Cudd_addIteConstant(dd,Fv,Gv,Hv);
    if (t == DD_NON_CONSTANT || !cuddIsConstant(t)) {
        cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    e = Cudd_addIteConstant(dd,Fnv,Gnv,Hnv);
    if (e == DD_NON_CONSTANT || !cuddIsConstant(e) || t != e) {
        cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, t);
    return(t);

}